

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeom_utility.h
# Opt level: O2

void GetSideShapeFunction<pzgeom::TPZGeoTriangle>
               (int side,TPZVec<Fad<double>_> *qsiSide,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  MElementType elType;
  ostream *poVar1;
  string local_1d0;
  stringstream sout;
  ostream local_1a0 [376];
  
  elType = pztopology::TPZTriangle::Type(side);
  switch(elType) {
  case EPoint:
    pztopology::TPZPoint::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case EOned:
    pztopology::TPZLine::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case ETriangle:
    pztopology::TPZTriangle::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case EQuadrilateral:
    pztopology::TPZQuadrilateral::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case ETetraedro:
    pztopology::TPZTetrahedron::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case EPiramide:
    pztopology::TPZPyramid::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case EPrisma:
    pztopology::TPZPrism::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  case ECube:
    pztopology::TPZCube::TShape<Fad<double>>(qsiSide,phi,dphi);
    return;
  default:
    std::__cxx11::stringstream::stringstream((stringstream *)&sout);
    poVar1 = std::operator<<(local_1a0,
                             "Could not find associated shape function to the side. Details are as follows:"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(local_1a0,"Element is of type ");
    MElementType_Name_abi_cxx11_(&local_1d0,ETriangle);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1d0);
    poVar1 = std::operator<<(local_1a0,"Side\t");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
    poVar1 = std::operator<<(poVar1," is of type\t");
    MElementType_Name_abi_cxx11_(&local_1d0,elType);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1d0);
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    std::__cxx11::stringbuf::str();
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1d0);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pzgeom_utility.h"
               ,0xe5);
  }
}

Assistant:

inline void GetSideShapeFunction(int side, TPZVec<Fad<REAL> > &qsiSide, TPZFMatrix<Fad<REAL> > &phi,TPZFMatrix<Fad<REAL> > &dphi ){
    MElementType  sideType = Topology::Type(side);
#ifdef PZDEBUG
    std::stringstream sout;
    REAL tol = 1e-12;
    TPZManVector<REAL,3> qsi(qsiSide.size());
    for (int i=0; i<qsi.size(); i++) {
        qsi[i] = qsiSide[i].val();
    }
    if(!IsInSideParametricDomain<Topology>(side,qsi,tol)){
        sout<<"The method expects the coordinates in the side's parametric domain. Exiting..."<<std::endl;
        PZError << "\n" << sout.str() << "\n";
        DebugStop();
    }
#endif
    switch (sideType){
        case EPoint:
            return pzgeom::TPZGeoPoint::TShape(qsiSide,phi,dphi);
        case EOned:
            return pzgeom::TPZGeoLinear::TShape(qsiSide,phi,dphi);
        case ETriangle:
            return pzgeom::TPZGeoTriangle::TShape(qsiSide,phi,dphi);
        case EQuadrilateral:
            return pzgeom::TPZGeoQuad::TShape(qsiSide,phi,dphi);
        case ETetraedro:
            return pzgeom::TPZGeoTetrahedra::TShape(qsiSide,phi,dphi);
        case EPiramide:
            return pzgeom::TPZGeoPyramid::TShape(qsiSide,phi,dphi);
        case EPrisma:
            return pzgeom::TPZGeoPrism::TShape(qsiSide,phi,dphi);
        case ECube:
            return pzgeom::TPZGeoCube::TShape(qsiSide,phi,dphi);
        default:{
            std::stringstream sout;
            sout<<"Could not find associated shape function to the side. Details are as follows:"<<std::endl;
            sout<<"Element is of type "<<MElementType_Name(Topology::Type())<<std::endl;
            sout<<"Side\t"<<side<<" is of type\t"<< MElementType_Name(sideType)<<std::endl;
            PZError<<std::endl<<sout.str()<<std::endl;
            DebugStop();
        }
    }
}